

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

int zddTreeSiftingAux(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  int iVar1;
  
  if (treenode != (MtrNode *)0x0) {
    do {
      if (treenode->child == (MtrNode *)0x0) {
        if ((1 < treenode->size) && (iVar1 = zddReorderChildren(table,treenode,method), iVar1 == 0))
        {
          return 0;
        }
      }
      else {
        iVar1 = zddTreeSiftingAux(table,treenode->child,method);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = zddReorderChildren(table,treenode,CUDD_REORDER_GROUP_SIFT);
        if (iVar1 == 0) {
          return 0;
        }
      }
      treenode = treenode->younger;
    } while (treenode != (MtrNode *)0x0);
  }
  return 1;
}

Assistant:

static int
zddTreeSiftingAux(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    MtrNode  *auxnode;
    int res;

#ifdef DD_DEBUG
    Mtr_PrintGroups(treenode,1);
#endif

    auxnode = treenode;
    while (auxnode != NULL) {
        if (auxnode->child != NULL) {
            if (!zddTreeSiftingAux(table, auxnode->child, method))
                return(0);
            res = zddReorderChildren(table, auxnode, CUDD_REORDER_GROUP_SIFT);
            if (res == 0)
                return(0);
        } else if (auxnode->size > 1) {
            if (!zddReorderChildren(table, auxnode, method))
                return(0);
        }
        auxnode = auxnode->younger;
    }

    return(1);

}